

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O0

bool __thiscall
ParsePackage::ParseFuncCall
          (ParsePackage *this,char *buf,int len,string *func_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *func_str_map,vector<cppnet::Any,_std::allocator<cppnet::Any>_> *res)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  pointer ppVar5;
  _Self local_b8;
  _Self local_b0;
  const_iterator iter;
  size_t index;
  string func_str;
  int local_68;
  int local_64;
  int num;
  int state;
  char *cur;
  char *pos;
  char *next;
  char *end;
  vector<cppnet::Any,_std::allocator<cppnet::Any>_> *res_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *func_str_map_local;
  string *func_name_local;
  int len_local;
  char *buf_local;
  ParsePackage *this_local;
  
  if (buf == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_64 = 2;
    local_68 = 0;
    std::__cxx11::string::string((string *)&index);
    pcVar4 = buf;
    while (pos = pcVar4, iVar2 = strcmp(pos,"\r\n\r\n"), iVar2 != 0) {
      if (buf + len < pos) {
        this_local._7_1_ = false;
        goto LAB_001125c6;
      }
      pcVar3 = strchr(pos,0x7c);
      if (pcVar3 == (char *)0x0) {
        this_local._7_1_ = false;
        goto LAB_001125c6;
      }
      pcVar4 = pcVar3 + 1;
      *pcVar3 = '\0';
      if (local_64 == 2) {
        std::__cxx11::string::operator=((string *)func_name,pos);
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(func_str_map,func_name);
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(func_str_map);
        bVar1 = std::operator!=(&local_b0,&local_b8);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_001125c6;
        }
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_b0);
        std::__cxx11::string::operator=((string *)&index,(string *)&ppVar5->second);
        local_64 = 3;
        std::__cxx11::string::find((char *)&index,0x15f376);
      }
      else if (local_64 == 3) {
        local_68 = atoi(pos);
        local_64 = 4;
      }
      else if (local_64 == 4) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&index);
        if (*pcVar3 == 'v') {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&index);
          bVar1 = _ParseVec(this,pos,*pcVar3,res);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_001125c6;
          }
          if ((local_68 == 1) &&
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&index), *pcVar3 == ')')) {
            this_local._7_1_ = true;
            goto LAB_001125c6;
          }
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&index);
          bVar1 = _ParseParam(this,pos,*pcVar3,res);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_001125c6;
          }
          if ((local_68 == 1) &&
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&index), *pcVar3 == ')')) {
            this_local._7_1_ = true;
            goto LAB_001125c6;
          }
        }
        local_68 = local_68 + -1;
      }
    }
    this_local._7_1_ = true;
LAB_001125c6:
    std::__cxx11::string::~string((string *)&index);
  }
  return this_local._7_1_;
}

Assistant:

bool ParsePackage::ParseFuncCall(char* buf, int len, std::string& func_name, const std::map<std::string, std::string>& func_str_map, std::vector<cppnet::Any>& res) {
    if (!buf) {
        return false;
    }
    char* end = buf + len;
    char* next = buf;
    char* pos = nullptr;
    char* cur = nullptr;

    int state = PARSE_NAME;
    int num = 0;
    std::string func_str;
    size_t index = 0;
    for (;;) {
        cur = next;
        if (strcmp(cur, "\r\n\r\n") == 0) {
            return true;
        }
        if (cur > end) {
            return false;
        }
        pos = strchr(cur, '|');
        if (pos) {
            next = pos + 1;
            *pos = '\0';

        } else {
            return false;
        }
        switch (state) {
        case PARSE_NAME:
        {
            func_name = cur;
            auto iter = func_str_map.find(func_name);
            if (iter != func_str_map.end()) {
                func_str = iter->second;
                state = PARSE_NUM;
                index = func_str.find("(") + 1;
                break;
            }
            return false;
        }
            
        case PARSE_NUM:
            num = atoi(cur);
            state = PARSE_PARAM;
            break;
        case PARSE_PARAM:
            if (func_str[index] == 'v') {
                if (_ParseVec(cur, func_str[++index], res)) {
                    num--;
                    index++;
                    if (num == 0 && func_str[index] == ')') {
                        return true;
                    }
                } else {
                    return false;
                }
            } else {
                if (_ParseParam(cur, func_str[index++], res)) {
                    num--;
                    if (num == 0 && func_str[index] == ')') {
                        return true;
                    }
                } else {
                    return false;
                }
            }
            break;
        }
    }
    return false;
}